

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O3

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  If_Cut_t *pCut;
  undefined1 *puVar1;
  float fVar2;
  char cVar3;
  short sVar4;
  If_Cut_t *pC0;
  If_Cut_t *pC;
  Vec_Mem_t *pVVar5;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var6;
  _func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *p_Var7;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var8;
  bool bVar9;
  bool bVar10;
  int w;
  int iVar11;
  uint uVar12;
  int iVar13;
  If_Man_t *pIVar14;
  word *pwVar15;
  int *piVar16;
  If_Par_t *pIVar17;
  char *pcVar18;
  ulong uVar19;
  If_Obj_t *pIVar20;
  If_Set_t *pIVar21;
  word *pwVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  float *pfVar29;
  ulong uVar30;
  long lVar31;
  If_Cut_t *pIVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  word wVar36;
  If_Cut_t *pIVar37;
  ulong *puVar38;
  Vec_Str_t *pVVar39;
  ulong uVar40;
  If_Cut_t *pIVar41;
  If_Cut_t *pIVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  Vec_Int_t *pVVar46;
  void *__s;
  If_Man_t *pIVar47;
  uint uVar48;
  ulong *puVar49;
  ulong *puVar50;
  int iVar51;
  uint uVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar65;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar90 [16];
  word *pLimit;
  word *tLimit_1;
  word *tLimit;
  int Cost;
  uint local_880;
  If_Cut_t local_838 [32];
  ulong local_438 [129];
  
  pIVar17 = p->pPars;
  local_880 = 1;
  if ((((((pIVar17->fDelayOpt == 0) && (pIVar17->fDelayOptLut == 0)) && (pIVar17->fDsdBalance == 0))
       && ((pIVar17->fUserRecLib == 0 && (pIVar17->fUserSesLib == 0)))) &&
      (pIVar17->fUseDsdTune == 0)) &&
     (((pIVar17->fUseCofVars == 0 && (pIVar17->fUseAndVars == 0)) &&
      ((pIVar17->fUse34Spec == 0 && (pIVar17->pLutStruct == (char *)0x0)))))) {
    local_880 = (uint)(pIVar17->pFuncCell2 !=
                      (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0);
  }
  bVar9 = true;
  if (pIVar17->nAndDelay < 1) {
    bVar9 = 0 < pIVar17->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xac,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xad,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 0) {
    pObj->EstRefs = (float)pObj->nRefs;
    bVar10 = true;
  }
  else {
    if (Mode == 1) {
      iVar11 = pObj->nRefs;
      pObj->EstRefs = (pObj->EstRefs + pObj->EstRefs + (float)iVar11) / 3.0;
    }
    else {
      iVar11 = pObj->nRefs;
    }
    if (0 < iVar11) {
      If_CutAreaDeref(p,&pObj->CutBest);
    }
    bVar10 = false;
  }
  pIVar14 = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pCut = &pObj->CutBest;
  if (fFirst != 0) goto LAB_0042eedf;
  pIVar17 = p->pPars;
  if (pIVar17->fDelayOpt == 0) {
    if (pIVar17->fDsdBalance != 0) {
      pIVar47 = p;
      iVar11 = If_CutDsdBalanceEval(p,pCut,(Vec_Int_t *)0x0);
      iVar13 = (int)pIVar47;
      goto LAB_0042edb6;
    }
    if (pIVar17->fUserRecLib != 0) {
      pIVar47 = p;
      iVar11 = If_CutDelayRecCost3(p,pCut,pObj);
      iVar13 = (int)pIVar47;
      goto LAB_0042edb6;
    }
    if (pIVar17->fUserSesLib == 0) {
      if (pIVar17->fDelayOptLut != 0) {
        pIVar47 = p;
        iVar11 = If_CutLutBalanceEval(p,pCut);
        iVar13 = (int)pIVar47;
        goto LAB_0042edb6;
      }
      if (0 < pIVar17->nGateSize) {
        pIVar47 = p;
        iVar11 = If_CutDelaySop(p,pCut);
        iVar13 = (int)pIVar47;
        goto LAB_0042edb6;
      }
      pIVar47 = p;
      fVar53 = If_CutDelay(p,pObj,pCut);
      iVar13 = (int)pIVar47;
      goto LAB_0042edbd;
    }
    local_838[0]._0_8_ = local_838[0]._0_8_ & 0xffffffff00000000;
    puVar1 = &(pObj->CutBest).field_0x1d;
    *puVar1 = *puVar1 | 0x20;
    pwVar22 = If_CutTruthW(p,pCut);
    bVar23 = (pObj->CutBest).field_0x1f;
    piVar16 = If_CutArrTimeProfile(p,pCut);
    bVar24 = (pObj->CutBest).field_0x1f;
    iVar11 = If_ManCutAigDelay(p,pObj,pCut);
    iVar11 = Abc_ExactDelayCost(pwVar22,(uint)bVar23,piVar16,&pObj[1].field_0x0 + (ulong)bVar24 * 4,
                                (int *)local_838,iVar11);
    iVar13 = (int)pwVar22;
    fVar53 = (float)iVar11;
    (pObj->CutBest).Delay = fVar53;
    if (local_838[0].Area == 0.0047237873) {
      uVar25 = *(uint *)&(pObj->CutBest).field_0x1c;
      if (0xffffff < uVar25) {
        __s = &pObj[1].field_0x0 + (ulong)(uVar25 >> 0x18) * 4;
        memset(__s,0x78,(ulong)(uVar25 >> 0x18));
        iVar13 = (int)__s;
        fVar53 = (pObj->CutBest).Delay;
      }
      *(uint *)&(pObj->CutBest).field_0x1c = uVar25 | 0x4fff;
    }
  }
  else {
    pIVar47 = p;
    iVar11 = If_CutSopBalanceEval(p,pCut,(Vec_Int_t *)0x0);
    iVar13 = (int)pIVar47;
LAB_0042edb6:
    fVar53 = (float)iVar11;
LAB_0042edbd:
    (pObj->CutBest).Delay = fVar53;
  }
  if ((fVar53 == -1.0) && (!NAN(fVar53))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xd9,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar2 = p->fEpsilon;
  if (fVar2 + fVar2 + pObj->Required < fVar53) {
    Abc_Print(iVar13,
              "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n"
              ,(double)fVar53,(double)(pObj->Required + fVar2),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    fVar53 = If_CutAreaDerefed(p,pCut);
    pCut->Area = fVar53;
    pIVar17 = p->pPars;
    if (pIVar17->fEdge != 0) {
      fVar53 = If_CutEdgeDerefed(p,pCut);
      (pObj->CutBest).Edge = fVar53;
      pIVar17 = p->pPars;
    }
    if (pIVar17->fPower != 0) {
      fVar53 = If_CutPowerDerefed(p,pCut,pObj);
LAB_0042eea3:
      (pObj->CutBest).Power = fVar53;
    }
  }
  else {
    fVar53 = If_CutAreaFlow(p,pCut);
    pCut->Area = fVar53;
    pIVar17 = p->pPars;
    if (pIVar17->fEdge != 0) {
      fVar53 = If_CutEdgeFlow(p,pCut);
      (pObj->CutBest).Edge = fVar53;
      pIVar17 = p->pPars;
    }
    if (pIVar17->fPower != 0) {
      fVar53 = If_CutPowerFlow(p,pCut,pObj);
      goto LAB_0042eea3;
    }
  }
  if (fPreprocess == 0) {
    pIVar20 = pIVar14->pConst1;
    sVar4 = *(short *)((long)&pIVar14->pName + 2);
    *(short *)((long)&pIVar14->pName + 2) = sVar4 + 1;
    memcpy(*(If_Cut_t **)((long)&pIVar20->field_0x0 + (long)sVar4 * 8),pCut,(long)p->nCutBytes);
  }
LAB_0042eedf:
  pIVar20 = pObj->pFanin0;
  pIVar21 = pIVar20->pCutSet;
  if (0 < pIVar21->nCuts) {
    lVar45 = 0;
    do {
      pC0 = pIVar21->ppCuts[lVar45];
      if (pC0 == (If_Cut_t *)0x0) break;
      pIVar21 = pObj->pFanin1->pCutSet;
      if (0 < pIVar21->nCuts) {
        lVar31 = 0;
        do {
          pIVar37 = pIVar21->ppCuts[lVar31];
          if (pIVar37 == (If_Cut_t *)0x0) break;
          sVar4 = *(short *)((long)&pIVar14->pName + 2);
          if (*(short *)&pIVar14->pName < sVar4) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                          ,0xed,
                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
          }
          uVar25 = pIVar37->uSign | pC0->uSign;
          uVar25 = (uVar25 >> 1 & 0x55555555) + (uVar25 & 0x55555555);
          uVar25 = (uVar25 >> 2 & 0x33333333) + (uVar25 & 0x33333333);
          uVar25 = (uVar25 >> 4 & 0x7070707) + (uVar25 & 0x7070707);
          uVar25 = (uVar25 >> 8 & 0xf000f) + (uVar25 & 0xf000f);
          if ((int)((uVar25 >> 0x10) + (uVar25 & 0xffff)) <= p->pPars->nLutSize) {
            pC = *(If_Cut_t **)((long)&pIVar14->pConst1->field_0x0 + (long)sVar4 * 8);
            uVar25 = *(uint *)pObj >> 4 & 1 ^ *(uint *)&pC0->field_0x1c >> 0xc & 1 ^ pC0->iCutFunc;
            uVar35 = *(uint *)pObj >> 5 & 1 ^ pIVar37->iCutFunc ^
                     *(uint *)&pIVar37->field_0x1c >> 0xc & 1;
            pIVar32 = pIVar37;
            pIVar41 = pC0;
            uVar52 = uVar35;
            if (p->pPars->fUseTtPerm == 0) {
              iVar11 = If_CutMergeOrdered(p,pC0,pIVar37,pC);
            }
            else {
              uVar12 = *(uint *)&pC0->field_0x1c >> 0x18;
              uVar26 = *(uint *)&pIVar37->field_0x1c >> 0x18;
              if ((uVar12 <= uVar26) && ((uVar12 != uVar26 || ((int)uVar25 <= (int)uVar35)))) {
                pIVar32 = pC0;
                pIVar41 = pIVar37;
                uVar52 = uVar25;
                uVar25 = uVar35;
              }
              iVar11 = If_CutMerge(p,pIVar41,pIVar32,pC);
            }
            if ((iVar11 != 0) &&
               (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize))))
            {
              p->nCutsMerged = p->nCutsMerged + 1;
              p->nCutsTotal = p->nCutsTotal + 1;
              if ((p->pPars->fSkipCutFilter != 0) ||
                 (iVar11 = If_CutFilter((If_Set_t *)pIVar14,pC,local_880), iVar11 == 0)) {
                uVar35 = 0;
                if (((bool)((*(uint *)&pC->field_0x1c & 0xff000000) == 0x2000000 & bVar9)) &&
                   (uVar35 = 0, pC[1].Area == (float)pObj->pFanin0->Id)) {
                  uVar35 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
                }
                pC->iCutFunc = -1;
                *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar35;
                pIVar17 = p->pPars;
                if (pIVar17->fTruth != 0) {
                  if (pIVar17->fVerbose == 0) {
                    lVar33 = 0;
                  }
                  else {
                    iVar11 = clock_gettime(3,(timespec *)local_838);
                    if (iVar11 < 0) {
                      lVar33 = 1;
                    }
                    else {
                      lVar33 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                                      SEXT816((long)local_838[0]._8_8_),8);
                      lVar33 = ((lVar33 >> 7) - (lVar33 >> 0x3f)) + local_838[0]._0_8_ * -1000000;
                    }
                    pIVar17 = p->pPars;
                  }
                  pIVar42 = pC;
                  if (pIVar17->fUseTtPerm == 0) {
                    iVar11 = If_CutComputeTruth(p,pC,pC0,pIVar37,*(uint *)pObj >> 4 & 1,
                                                *(uint *)pObj >> 5 & 1);
                  }
                  else {
                    iVar11 = If_CutComputeTruthPerm(p,pC,pIVar41,pIVar32,uVar25,uVar52);
                  }
                  pIVar17 = p->pPars;
                  if (pIVar17->fVerbose != 0) {
                    pIVar42 = local_838;
                    iVar13 = clock_gettime(3,(timespec *)pIVar42);
                    if (iVar13 < 0) {
                      lVar34 = -1;
                    }
                    else {
                      lVar34 = (long)local_838[0]._8_8_ / 1000 + local_838[0]._0_8_ * 1000000;
                    }
                    p->timeCache[4] = p->timeCache[4] + lVar34 + lVar33;
                    pIVar17 = p->pPars;
                  }
                  if ((pIVar17->fSkipCutFilter == 0) && (iVar11 != 0)) {
                    pIVar42 = pC;
                    iVar11 = If_CutFilter((If_Set_t *)pIVar14,pC,local_880);
                    if (iVar11 != 0) goto LAB_0042efa6;
                    pIVar17 = p->pPars;
                  }
                  if ((pIVar17->fLut6Filter != 0) && (pC->field_0x1f == '\x06')) {
                    pIVar42 = pC;
                    iVar11 = If_CutCheckTruth6(p,pC);
                    if (iVar11 == 0) goto LAB_0042efa6;
                    pIVar17 = p->pPars;
                  }
                  if (pIVar17->fUseDsd == 0) {
                    uVar25 = *(uint *)&pC->field_0x1c;
                  }
                  else {
                    uVar25 = pC->iCutFunc;
                    if ((int)uVar25 < 0) goto LAB_00431041;
                    uVar52 = uVar25 >> 1;
                    uVar43 = (ulong)(byte)pC->field_0x1f;
                    pVVar46 = p->vTtDsds[uVar43];
                    if ((int)uVar52 < pVVar46->nSize) {
                      if (pVVar46->pArray[uVar52] == -1) goto LAB_0042f3fb;
                    }
                    else {
                      do {
                        Vec_IntPush(pVVar46,(int)pIVar42);
                        uVar43 = (ulong)(byte)pC->field_0x1f;
                        uVar25 = 0;
                        do {
                          pVVar39 = p->vTtPerms[uVar43];
                          uVar35 = pVVar39->nSize;
                          if (uVar35 == pVVar39->nCap) {
                            if ((int)uVar35 < 0x10) {
                              if (pVVar39->pArray == (char *)0x0) {
                                pcVar18 = (char *)malloc(0x10);
                              }
                              else {
                                pIVar42 = (If_Cut_t *)&DAT_00000010;
                                pcVar18 = (char *)realloc(pVVar39->pArray,0x10);
                              }
                              pVVar39->pArray = pcVar18;
                              pVVar39->nCap = 0x10;
                            }
                            else {
                              pIVar37 = (If_Cut_t *)((ulong)uVar35 * 2);
                              if (pVVar39->pArray == (char *)0x0) {
                                pcVar18 = (char *)malloc((size_t)pIVar37);
                              }
                              else {
                                pIVar42 = pIVar37;
                                pcVar18 = (char *)realloc(pVVar39->pArray,(size_t)pIVar37);
                              }
                              pVVar39->pArray = pcVar18;
                              pVVar39->nCap = (int)pIVar37;
                            }
                          }
                          else {
                            pcVar18 = pVVar39->pArray;
                          }
                          iVar11 = pVVar39->nSize;
                          pVVar39->nSize = iVar11 + 1;
                          pcVar18[iVar11] = 'x';
                          uVar25 = uVar25 + 1;
                          bVar23 = pC->field_0x1f;
                          uVar43 = (ulong)bVar23;
                          uVar35 = 6;
                          if (6 < bVar23) {
                            uVar35 = (uint)bVar23;
                          }
                        } while (uVar25 < uVar35);
                        pVVar46 = p->vTtDsds[uVar43];
                      } while (pVVar46->nSize <= (int)uVar52);
                      uVar25 = pC->iCutFunc;
LAB_0042f3fb:
                      pVVar5 = p->vTtMem[uVar43];
                      if (pVVar5 == (Vec_Mem_t *)0x0) {
                        if ((int)uVar25 < 0) goto LAB_00431041;
                        pwVar22 = (word *)0x0;
                      }
                      else {
                        if ((int)uVar25 < 0) goto LAB_00431041;
                        uVar35 = uVar25 >> 1;
                        if (pVVar5->nEntries <= (int)uVar35) goto LAB_004310dc;
                        pwVar22 = pVVar5->ppPages[uVar35 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                  (ulong)(uVar35 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                      }
                      uVar28 = 6;
                      if (6 < (uint)uVar43) {
                        uVar28 = uVar43;
                      }
                      uVar25 = (int)uVar28 * (uVar25 >> 1);
                      if (p->vTtPerms[uVar43]->nSize <= (int)uVar25) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                      }
                      iVar11 = If_DsdManCompute(p->pIfDsdMan,pwVar22,(uint)uVar43,
                                                (uchar *)(p->vTtPerms[uVar43]->pArray + uVar25),
                                                p->pPars->pLutStruct);
                      if (p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar52) goto LAB_0043111a;
                      p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar52] = iVar11;
                      uVar25 = pC->iCutFunc;
                      if ((int)uVar25 < 0) goto LAB_00431060;
                    }
                    uVar52 = p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar25 >> 1];
                    if ((int)uVar52 < 0) goto LAB_00431022;
                    uVar52 = uVar52 ^ uVar25 & 1;
                    pIVar42 = (If_Cut_t *)(ulong)uVar52;
                    uVar52 = If_DsdManSuppSize(p->pIfDsdMan,uVar52);
                    uVar25 = *(uint *)&pC->field_0x1c;
                    if (uVar52 != uVar25 >> 0x18) {
                      __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                    ,0x138,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                  }
                  uVar52 = uVar25 & 0xffffbfff;
                  *(uint *)&pC->field_0x1c = uVar52;
                  pIVar17 = p->pPars;
                  p_Var6 = pIVar17->pFuncCell;
                  if ((p_Var6 == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) &&
                     (pIVar17->pFuncCell2 ==
                      (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
                    if (pIVar17->fUseDsdTune == 0) {
                      if (pIVar17->fUse34Spec == 0) {
                        if (pIVar17->fUseAndVars != 0) {
                          if (pC->iCutFunc < 0) goto LAB_00431041;
                          iVar11 = pIVar17->nLutSize;
                          if (0xd < iVar11) {
                            __assert_fail("p->pPars->nLutSize <= 13",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                          ,0x176,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar35 = (uint)pC->iCutFunc >> 1;
                          uVar43 = (ulong)(uVar25 >> 0x18);
                          if ((p->vTtDecs[uVar43]->nSize <= (int)uVar35) ||
                             (p->vTtDecs[uVar43]->pArray[uVar35] == -1)) {
                            pVVar46 = p->vTtDecs[uVar43];
                            if (pVVar46->nSize <= (int)uVar35) {
                              do {
                                Vec_IntPush(pVVar46,(int)pIVar42);
                                uVar52 = *(uint *)&pC->field_0x1c;
                                uVar43 = (ulong)(uVar52 >> 0x18);
                                pVVar46 = p->vTtDecs[uVar43];
                              } while (pVVar46->nSize <= (int)uVar35);
                              iVar11 = p->pPars->nLutSize;
                            }
                            iVar13 = iVar11 / 2;
                            uVar25 = 0;
                            iVar51 = (int)uVar43;
                            if ((iVar13 < iVar51) &&
                               (iVar51 <= (int)(iVar11 - (iVar11 >> 0x1f) & 0xfffffffeU))) {
                              pVVar5 = p->vTtMem[uVar43];
                              if (pVVar5 == (Vec_Mem_t *)0x0) {
                                pwVar22 = (word *)0x0;
                              }
                              else {
                                if (pC->iCutFunc < 0) goto LAB_00431041;
                                uVar25 = (uint)pC->iCutFunc >> 1;
                                if (pVVar5->nEntries <= (int)uVar25) goto LAB_004310dc;
                                pwVar22 = pVVar5->ppPages
                                          [uVar25 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                          (ulong)(uVar25 & pVVar5->PageMask) *
                                          (long)pVVar5->nEntrySize;
                              }
                              uVar12 = 1 << ((char)uVar43 - 6U & 0x1f);
                              if (uVar52 < 0x7000000) {
                                uVar12 = 1;
                              }
                              if ((int)uVar12 < 1) {
                                uVar25 = Abc_TtProcessBiDecInt((word *)local_838,iVar51,iVar13);
                                if (uVar25 == 0) goto LAB_004305d6;
                              }
                              else {
                                memcpy(local_838,pwVar22,(ulong)uVar12 * 8);
                                uVar25 = Abc_TtProcessBiDecInt((word *)local_838,iVar51,iVar13);
                                if (uVar25 == 0) {
                                  uVar43 = 0;
                                  do {
                                    *(word *)(&local_838[0].Area + uVar43 * 2) = ~pwVar22[uVar43];
                                    uVar43 = uVar43 + 1;
                                  } while (uVar12 != uVar43);
LAB_004305d6:
                                  uVar52 = Abc_TtProcessBiDecInt((word *)local_838,iVar51,iVar13);
                                  uVar25 = uVar52 | 0x40000000;
                                  if (uVar52 == 0) {
                                    uVar25 = 0;
                                  }
                                }
                              }
                              uVar52 = *(uint *)&pC->field_0x1c;
                            }
                            if (p->vTtDecs[uVar52 >> 0x18]->nSize <= (int)uVar35) {
LAB_0043111a:
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                            }
                            p->vTtDecs[uVar52 >> 0x18]->pArray[uVar35] = uVar25;
                            uVar52 = *(uint *)&pC->field_0x1c;
                          }
                          if (p->vTtDecs[uVar52 >> 0x18]->nSize <= (int)uVar35) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                          }
                          iVar11 = p->vTtDecs[uVar52 >> 0x18]->pArray[uVar35];
                          if (iVar11 < 0) {
                            __assert_fail("iDecMask >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                          ,0x182,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar25 = 0;
                          if (iVar11 == 0) {
                            uVar25 = (uint)(p->pPars->nLutSize / 2 < (int)(uVar52 >> 0x18)) << 0xe;
                          }
                          *(uint *)&pC->field_0x1c = uVar52 & 0xffffbfff | uVar25;
                          p->nCutsUselessAll = p->nCutsUselessAll + (uVar25 >> 0xe);
                          p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                               p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                               (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                          p->nCutsCountAll = p->nCutsCountAll + 1;
                          p->nCutsCount[(byte)pC->field_0x1f] =
                               p->nCutsCount[(byte)pC->field_0x1f] + 1;
                          pIVar17 = p->pPars;
                        }
                        if ((pIVar17->fUseCofVars != 0) &&
                           ((pIVar17->fUseAndVars == 0 || ((pC->field_0x1d & 0x40) != 0)))) {
                          if (pC->iCutFunc < 0) goto LAB_00431041;
                          uVar52 = (uint)pC->iCutFunc >> 1;
                          uVar25 = *(uint *)&pC->field_0x1c;
                          uVar43 = (ulong)(uVar25 >> 0x18);
                          pVVar39 = p->vTtVars[uVar43];
                          iVar11 = pVVar39->nSize;
                          if ((int)uVar52 < iVar11) {
                            if (pVVar39->pArray[uVar52] == -1) goto LAB_004307a1;
                          }
                          else {
                            do {
                              if (iVar11 == pVVar39->nCap) {
                                if (iVar11 < 0x10) {
                                  if (pVVar39->pArray == (char *)0x0) {
                                    pcVar18 = (char *)malloc(0x10);
                                  }
                                  else {
                                    pcVar18 = (char *)realloc(pVVar39->pArray,0x10);
                                  }
                                  pVVar39->pArray = pcVar18;
                                  pVVar39->nCap = 0x10;
                                }
                                else {
                                  uVar25 = iVar11 * 2;
                                  if (pVVar39->pArray == (char *)0x0) {
                                    pcVar18 = (char *)malloc((ulong)uVar25);
                                  }
                                  else {
                                    pcVar18 = (char *)realloc(pVVar39->pArray,(ulong)uVar25);
                                  }
                                  pVVar39->pArray = pcVar18;
                                  pVVar39->nCap = uVar25;
                                }
                              }
                              else {
                                pcVar18 = pVVar39->pArray;
                              }
                              iVar11 = pVVar39->nSize;
                              pVVar39->nSize = iVar11 + 1;
                              pcVar18[iVar11] = -1;
                              uVar25 = *(uint *)&pC->field_0x1c;
                              uVar43 = (ulong)(uVar25 >> 0x18);
                              pVVar39 = p->vTtVars[uVar43];
                              iVar11 = pVVar39->nSize;
                            } while (iVar11 <= (int)uVar52);
LAB_004307a1:
                            pVVar5 = p->vTtMem[uVar43];
                            if (pVVar5 == (Vec_Mem_t *)0x0) {
                              puVar49 = (ulong *)0x0;
                            }
                            else {
                              if (pC->iCutFunc < 0) {
LAB_00431041:
                                __assert_fail("Lit >= 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                              ,0x12f,"int Abc_Lit2Var(int)");
                              }
                              uVar35 = (uint)pC->iCutFunc >> 1;
                              if (pVVar5->nEntries <= (int)uVar35) goto LAB_004310dc;
                              puVar49 = pVVar5->ppPages[uVar35 >> ((byte)pVVar5->LogPageSze & 0x1f)]
                                        + (ulong)(uVar35 & pVVar5->PageMask) *
                                          (long)pVVar5->nEntrySize;
                            }
                            uVar12 = 1 << ((char)uVar43 - 6U & 0x1f);
                            uVar35 = uVar12;
                            if (uVar25 < 0x7000000) {
                              uVar35 = 1;
                            }
                            if (0xdffffff < uVar25) {
                              __assert_fail("nVars <= nVarsMax",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                            ,0x5eb,"int Abc_TtCheckCondDep(word *, int, int)");
                            }
                            uVar28 = 0;
                            if (0xffffff < uVar25) {
                              iVar11 = p->pPars->nLutSize / 2;
                              if (iVar11 + 1 < (int)uVar43) {
                                uVar26 = uVar12;
                                if ((int)uVar12 < 2) {
                                  uVar26 = 1;
                                }
                                uVar19 = 0;
LAB_00430893:
                                uVar28 = uVar19;
                                bVar23 = (byte)uVar28;
                                if (uVar35 == 1) {
                                  uVar44 = s_Truths6Neg[uVar28] & *puVar49;
                                  bVar23 = (byte)(1 << (bVar23 & 0x1f));
                                  uVar19 = *puVar49 & s_Truths6[uVar28];
                                  uVar44 = uVar44 << (bVar23 & 0x3f) | uVar44;
                                  local_838[0].Area = (float)(int)uVar44;
                                  local_838[0].Edge = (float)(int)(uVar44 >> 0x20);
                                  local_438[0] = uVar19 >> (bVar23 & 0x3f) | uVar19;
                                }
                                else {
                                  if (uVar28 < 6) {
                                    if ((int)uVar35 < 1) goto LAB_004308ec;
                                    uVar19 = s_Truths6Neg[uVar28];
                                    uVar44 = 0;
                                    do {
                                      *(ulong *)(&local_838[0].Area + uVar44 * 2) =
                                           (puVar49[uVar44] & uVar19) <<
                                           ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                           puVar49[uVar44] & uVar19;
                                      uVar44 = uVar44 + 1;
                                    } while (uVar35 != uVar44);
                                  }
                                  else {
                                    if ((int)uVar35 < 1) goto LAB_004308ec;
                                    bVar24 = (byte)(uVar28 - 6);
                                    uVar48 = 1 << (bVar24 & 0x1f);
                                    lVar33 = (long)(2 << (bVar24 & 0x1f));
                                    uVar19 = 1;
                                    if (1 < (int)uVar48) {
                                      uVar19 = (ulong)uVar48;
                                    }
                                    pfVar29 = &local_838[0].Area + (long)(int)uVar48 * 2;
                                    pIVar37 = local_838;
                                    puVar38 = puVar49;
                                    do {
                                      if (uVar28 - 6 != 0x1f) {
                                        uVar44 = 0;
                                        do {
                                          uVar30 = puVar38[uVar44];
                                          *(ulong *)(&pIVar37->Area + uVar44 * 2) = uVar30;
                                          *(ulong *)(pfVar29 + uVar44 * 2) = uVar30;
                                          uVar44 = uVar44 + 1;
                                        } while (uVar19 != uVar44);
                                      }
                                      puVar38 = puVar38 + lVar33;
                                      pfVar29 = pfVar29 + lVar33 * 2;
                                      pIVar37 = (If_Cut_t *)(&pIVar37->Area + lVar33 * 2);
                                    } while (puVar38 < puVar49 + (int)uVar35);
                                  }
                                  if (uVar28 < 6) {
                                    if (0 < (int)uVar35) {
                                      uVar19 = s_Truths6[uVar28];
                                      uVar44 = 0;
                                      do {
                                        local_438[uVar44] =
                                             (puVar49[uVar44] & uVar19) >>
                                             ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                             puVar49[uVar44] & uVar19;
                                        uVar44 = uVar44 + 1;
                                      } while (uVar35 != uVar44);
                                    }
                                  }
                                  else if (0 < (int)uVar35) {
                                    bVar23 = (byte)(uVar28 - 6);
                                    uVar48 = 1 << (bVar23 & 0x1f);
                                    iVar13 = 2 << (bVar23 & 0x1f);
                                    uVar19 = 1;
                                    if (1 < (int)uVar48) {
                                      uVar19 = (ulong)uVar48;
                                    }
                                    puVar38 = local_438;
                                    puVar50 = puVar49;
                                    do {
                                      if (uVar28 - 6 != 0x1f) {
                                        uVar44 = 0;
                                        do {
                                          uVar30 = puVar50[(long)(int)uVar48 + uVar44];
                                          puVar38[uVar44] = uVar30;
                                          puVar38[(long)(int)uVar48 + uVar44] = uVar30;
                                          uVar44 = uVar44 + 1;
                                        } while (uVar19 != uVar44);
                                      }
                                      puVar50 = puVar50 + iVar13;
                                      puVar38 = puVar38 + iVar13;
                                    } while (puVar50 < puVar49 + (int)uVar35);
                                  }
                                }
LAB_004308ec:
                                uVar19 = 0;
                                iVar51 = 0;
                                iVar13 = 0;
LAB_00430916:
                                if (uVar28 != uVar19) {
                                  bVar23 = (byte)uVar19;
                                  if (0x6ffffff < uVar25) {
                                    if (uVar19 < 6) {
                                      uVar44 = 0;
                                      do {
                                        if (((*(ulong *)(&local_838[0].Area + uVar44 * 2) >>
                                              ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) ^
                                             *(ulong *)(&local_838[0].Area + uVar44 * 2)) &
                                            s_Truths6Neg[uVar19]) != 0) goto LAB_00430a0f;
                                        uVar44 = uVar44 + 1;
                                      } while (uVar26 != uVar44);
                                      iVar65 = 0;
                                    }
                                    else {
                                      uVar44 = (ulong)(uint)(1 << (bVar23 - 6 & 0x1f));
                                      uVar30 = (ulong)(uint)(2 << (bVar23 - 6 & 0x1f));
                                      pfVar29 = &local_838[0].Area + uVar44 * 2;
                                      pIVar37 = local_838;
                                      do {
                                        uVar40 = 0;
                                        do {
                                          if (*(long *)(&pIVar37->Area + uVar40 * 2) !=
                                              *(long *)(pfVar29 + uVar40 * 2)) goto LAB_00430a0f;
                                          uVar40 = uVar40 + 1;
                                        } while (uVar44 != uVar40);
                                        pIVar37 = (If_Cut_t *)(&pIVar37->Area + uVar30 * 2);
                                        pfVar29 = pfVar29 + uVar30 * 2;
                                        iVar65 = 0;
                                      } while (pIVar37 < (If_Cut_t *)
                                                         (&local_838[0].Area + (long)(int)uVar12 * 2
                                                         ));
                                    }
                                    goto LAB_00430a14;
                                  }
                                  bVar23 = (byte)(1 << (bVar23 & 0x1f));
                                  iVar13 = (iVar13 + 1) -
                                           (uint)((((ulong)local_838[0]._0_8_ >> (bVar23 & 0x3f) ^
                                                   local_838[0]._0_8_) & s_Truths6Neg[uVar19]) == 0)
                                  ;
                                  uVar27 = (uint)((s_Truths6Neg[uVar19] &
                                                  (local_438[0] >> (bVar23 & 0x3f) ^ local_438[0]))
                                                 != 0);
                                  goto LAB_00430ab0;
                                }
                                goto LAB_00430ac0;
                              }
                            }
LAB_00430cc3:
                            if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar52) {
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)")
                              ;
                            }
                            p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar52] = (char)uVar28;
                            uVar25 = *(uint *)&pC->field_0x1c;
                            uVar43 = (ulong)(uVar25 >> 0x18);
                          }
                          if (p->vTtVars[uVar43]->nSize <= (int)uVar52) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                          }
                          cVar3 = p->vTtVars[uVar43]->pArray[uVar52];
                          if ((cVar3 < '\0') || ((int)uVar43 < (int)cVar3)) {
                            __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                          ,0x194,
                                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                         );
                          }
                          uVar52 = (uint)(0xffffff < uVar25 && (int)uVar43 == (int)cVar3);
                          *(uint *)&pC->field_0x1c = uVar25 & 0xffffbfff | uVar52 << 0xe;
                          p->nCutsUselessAll = p->nCutsUselessAll + uVar52;
                          p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                               p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                               (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                          p->nCutsCountAll = p->nCutsCountAll + 1;
                          p->nCutsCount[(byte)pC->field_0x1f] =
                               p->nCutsCount[(byte)pC->field_0x1f] + 1;
                        }
                      }
                      else {
                        if (0x4ffffff < uVar25) {
                          __assert_fail("pCut->nLeaves <= 4",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                        ,0x16d,
                                        "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                       );
                        }
                        if ((uVar25 & 0x7000000) == 0x4000000) {
                          uVar25 = pC->iCutFunc;
                          if ((int)uVar25 < 0) goto LAB_0043107f;
                          pwVar22 = p->puTempW;
                          pVVar5 = p->vTtMem[4];
                          if (pVVar5 == (Vec_Mem_t *)0x0) {
                            pwVar15 = (word *)0x0;
                          }
                          else {
                            uVar52 = uVar25 >> 1;
                            if (pVVar5->nEntries <= (int)uVar52) goto LAB_004310dc;
                            pwVar15 = pVVar5->ppPages[uVar52 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                      (ulong)(uVar52 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                          }
                          uVar52 = p->nTruth6Words[4];
                          if ((uVar25 & 1) == 0) {
                            if (0 < (int)uVar52) {
                              uVar43 = 0;
                              do {
                                pwVar22[uVar43] = pwVar15[uVar43];
                                uVar43 = uVar43 + 1;
                              } while (uVar52 != uVar43);
                            }
                          }
                          else if (0 < (int)uVar52) {
                            uVar43 = 0;
                            do {
                              pwVar22[uVar43] = ~pwVar15[uVar43];
                              uVar43 = uVar43 + 1;
                            } while (uVar52 != uVar43);
                          }
                          uVar25 = (uint)*pwVar22;
                          uVar52 = uVar25 & 0xffff;
                          if ((((((uVar52 & uVar52 - 1) != 0) && ((uVar25 & 0xffff) != 0x6996)) &&
                               ((uVar25 & 0xffff) != 0x9669)) &&
                              (((uVar52 ^ 0xffff) & 0xfffe - uVar52) != 0)) &&
                             (((uVar25 = (uVar25 >> 1 & 0x5555) + (uVar25 & 0x5555),
                               uVar25 = (uVar25 >> 2 & 0x3333) + (uVar25 & 0x3333),
                               uVar25 = (uVar25 >> 4 & 0x707) + (uVar25 & 0x707),
                               iVar11 = (uVar25 >> 8) + (uVar25 & 0xff), uVar25 = uVar52 ^ 0xffff,
                               iVar11 != 9 && (uVar25 = uVar52, iVar11 != 7)) ||
                              (iVar11 = Abc_Tt4CheckTwoLevel(uVar25), iVar11 < 1)))) {
                            pC->field_0x1d = pC->field_0x1d | 0x40;
                          }
                        }
                      }
                    }
                    else {
                      uVar52 = pC->iCutFunc;
                      if ((int)uVar52 < 0) {
LAB_00431060:
                        __assert_fail("pCut->iCutFunc >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                                      ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
                      }
                      uVar25 = p->vTtDsds[uVar25 >> 0x18]->pArray[uVar52 >> 1];
                      if ((int)uVar25 < 0) {
LAB_00431022:
                        __assert_fail("Lit >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                      ,0x132,"int Abc_LitNotCond(int, int)");
                      }
                      uVar25 = If_DsdManReadMark(p->pIfDsdMan,uVar25 ^ uVar52 & 1);
                      *(uint *)&pC->field_0x1c =
                           *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar25 & 1) << 0xe;
                      p->nCutsUselessAll = p->nCutsUselessAll + (uVar25 & 1);
                      p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                           p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                           (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                      p->nCutsCountAll = p->nCutsCountAll + 1;
                      p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                    }
                  }
                  else {
                    if (pIVar17->fUseTtPerm != 0) {
                      __assert_fail("p->pPars->fUseTtPerm == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                    ,0x13f,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (0xc < (uVar25 >> 0x10 & 0xff) - 4) {
                      __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                    ,0x140,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (pIVar17->fUseDsd == 0) {
                      p_Var7 = pIVar17->pFuncCell2;
                      uVar52 = pC->iCutFunc;
                      if (p_Var7 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr
                                     *)0x0) {
                        if ((int)uVar52 < 0) goto LAB_0043107f;
                        pwVar22 = p->puTempW;
                        pVVar5 = p->vTtMem[uVar25 >> 0x18];
                        if (pVVar5 == (Vec_Mem_t *)0x0) {
                          pwVar15 = (word *)0x0;
                        }
                        else {
                          uVar35 = uVar52 >> 1;
                          if (pVVar5->nEntries <= (int)uVar35) goto LAB_004310dc;
                          pwVar15 = pVVar5->ppPages[uVar35 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                    (ulong)(uVar35 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                        }
                        uVar25 = p->nTruth6Words[uVar25 >> 0x18];
                        if ((uVar52 & 1) == 0) {
                          if (0 < (int)uVar25) {
                            uVar43 = 0;
                            do {
                              pwVar22[uVar43] = pwVar15[uVar43];
                              uVar43 = uVar43 + 1;
                            } while (uVar25 != uVar43);
                          }
                        }
                        else if (0 < (int)uVar25) {
                          uVar43 = 0;
                          do {
                            pwVar22[uVar43] = ~pwVar15[uVar43];
                            uVar43 = uVar43 + 1;
                          } while (uVar25 != uVar43);
                        }
                        uVar52 = *(uint *)&pC->field_0x1c >> 0x18;
                        uVar25 = 6;
                        if (6 < uVar52) {
                          uVar25 = uVar52;
                        }
                        iVar11 = (*p_Var6)(p,(uint *)pwVar22,uVar25,uVar52,pIVar17->pLutStruct);
                      }
                      else {
                        if ((int)uVar52 < 0) goto LAB_0043107f;
                        pwVar22 = p->puTempW;
                        pVVar5 = p->vTtMem[uVar25 >> 0x18];
                        if (pVVar5 == (Vec_Mem_t *)0x0) {
                          pwVar15 = (word *)0x0;
                        }
                        else {
                          uVar35 = uVar52 >> 1;
                          if (pVVar5->nEntries <= (int)uVar35) goto LAB_004310dc;
                          pwVar15 = pVVar5->ppPages[uVar35 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                    (ulong)(uVar35 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                        }
                        uVar25 = p->nTruth6Words[uVar25 >> 0x18];
                        if ((uVar52 & 1) == 0) {
                          if (0 < (int)uVar25) {
                            uVar43 = 0;
                            do {
                              pwVar22[uVar43] = pwVar15[uVar43];
                              uVar43 = uVar43 + 1;
                            } while (uVar25 != uVar43);
                          }
                        }
                        else if (0 < (int)uVar25) {
                          uVar43 = 0;
                          do {
                            pwVar22[uVar43] = ~pwVar15[uVar43];
                            uVar43 = uVar43 + 1;
                          } while (uVar25 != uVar43);
                        }
                        iVar11 = (*p_Var7)(p,pwVar22,(uint)(byte)pC->field_0x1f,(Vec_Str_t *)0x0,
                                           (char **)0x0);
                      }
                      uVar25 = (uint)(iVar11 == 0);
                    }
                    else {
                      uVar52 = pC->iCutFunc;
                      if ((int)uVar52 < 0) goto LAB_00431060;
                      uVar25 = p->vTtDsds[uVar25 >> 0x18]->pArray[uVar52 >> 1];
                      if ((int)uVar25 < 0) goto LAB_00431022;
                      uVar25 = If_DsdManCheckDec(p->pIfDsdMan,uVar25 ^ uVar52 & 1);
                      uVar25 = uVar25 & 1;
                    }
                    *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar25 << 0xe
                    ;
                    p->nCutsUselessAll = p->nCutsUselessAll + uVar25;
                    p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                         p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                         (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                    p->nCutsCountAll = p->nCutsCountAll + 1;
                    p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                    pIVar17 = p->pPars;
                    if (((pIVar17->fEnableCheck75 == 0) && (pIVar17->fEnableCheck75u == 0)) ||
                       (*(short *)&pC->field_0x1e != 0x505)) {
                      if ((pIVar17->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                        uVar25 = pC->iCutFunc;
                        if ((int)uVar25 < 0) goto LAB_0043107f;
                        pwVar22 = p->puTempW;
                        pVVar5 = p->vTtMem[5];
                        if (pVVar5 == (Vec_Mem_t *)0x0) {
                          pwVar15 = (word *)0x0;
                        }
                        else {
                          uVar52 = uVar25 >> 1;
                          if (pVVar5->nEntries <= (int)uVar52) goto LAB_004310dc;
                          pwVar15 = pVVar5->ppPages[uVar52 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                    (ulong)(uVar52 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                        }
                        uVar52 = p->nTruth6Words[5];
                        if ((uVar25 & 1) == 0) {
                          if (0 < (int)uVar52) {
                            uVar43 = 0;
                            do {
                              pwVar22[uVar43] = pwVar15[uVar43];
                              uVar43 = uVar43 + 1;
                            } while (uVar52 != uVar43);
                          }
                        }
                        else if (0 < (int)uVar52) {
                          uVar43 = 0;
                          do {
                            pwVar22[uVar43] = ~pwVar15[uVar43];
                            uVar43 = uVar43 + 1;
                          } while (uVar52 != uVar43);
                        }
                        wVar36 = CONCAT44((int)*pwVar22,(int)*pwVar22);
                        p->nCuts5 = p->nCuts5 + 1;
                        iVar11 = If_CluCheckDecInAny(wVar36,5);
                        if ((iVar11 != 0) || (iVar11 = If_CluCheckDecOut(wVar36,5), iVar11 != 0))
                        goto LAB_0042fa4c;
                      }
                    }
                    else {
                      uVar25 = pC->iCutFunc;
                      if ((int)uVar25 < 0) goto LAB_0043107f;
                      pwVar22 = p->puTempW;
                      pVVar5 = p->vTtMem[5];
                      if (pVVar5 == (Vec_Mem_t *)0x0) {
                        pwVar15 = (word *)0x0;
                      }
                      else {
                        uVar52 = uVar25 >> 1;
                        if (pVVar5->nEntries <= (int)uVar52) goto LAB_004310dc;
                        pwVar15 = pVVar5->ppPages[uVar52 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                  (ulong)(uVar52 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                      }
                      uVar52 = p->nTruth6Words[5];
                      if ((uVar25 & 1) == 0) {
                        if (0 < (int)uVar52) {
                          uVar43 = 0;
                          do {
                            pwVar22[uVar43] = pwVar15[uVar43];
                            uVar43 = uVar43 + 1;
                          } while (uVar52 != uVar43);
                        }
                      }
                      else if (0 < (int)uVar52) {
                        uVar43 = 0;
                        do {
                          pwVar22[uVar43] = ~pwVar15[uVar43];
                          uVar43 = uVar43 + 1;
                        } while (uVar52 != uVar43);
                      }
                      wVar36 = *pwVar22;
                      p->nCuts5 = p->nCuts5 + 1;
                      iVar11 = If_CluCheckDecInAny(CONCAT44((int)wVar36,(int)wVar36),5);
                      if (iVar11 == 0) goto LAB_0042efa6;
LAB_0042fa4c:
                      p->nCuts5a = p->nCuts5a + 1;
                    }
                  }
                }
                uVar52 = (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0)
                         << 0xd;
                uVar25 = *(uint *)&pC->field_0x1c;
                *(uint *)&pC->field_0x1c = uVar25 & 0xffffdfff | uVar52;
                p_Var8 = p->pPars->pFuncCost;
                if (p_Var8 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
                  uVar52 = uVar25 & 0xffffd000 | uVar52;
                  *(uint *)&pC->field_0x1c = uVar52;
                }
                else {
                  uVar25 = (*p_Var8)(p,pC);
                  uVar52 = *(uint *)&pC->field_0x1c & 0xfffff000 | uVar25 & 0xfff;
                  *(uint *)&pC->field_0x1c = uVar52;
                  if ((uVar25 & 0xfff) == 0xfff) goto LAB_0042efa6;
                }
                pIVar17 = p->pPars;
                if (pIVar17->fDelayOpt == 0) {
                  if (pIVar17->fDsdBalance != 0) {
                    iVar11 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                    goto LAB_0042fb0c;
                  }
                  if (pIVar17->fUserRecLib != 0) {
                    iVar11 = If_CutDelayRecCost3(p,pC,pObj);
                    goto LAB_0042fb0c;
                  }
                  if (pIVar17->fUserSesLib == 0) {
                    if (pIVar17->fDelayOptLut != 0) {
                      iVar11 = If_CutLutBalanceEval(p,pC);
                      goto LAB_0042fb0c;
                    }
                    if (pIVar17->nGateSize < 1) {
                      fVar53 = If_CutDelay(p,pObj,pC);
                    }
                    else {
                      iVar11 = If_CutDelaySop(p,pC);
                      fVar53 = (float)iVar11;
                    }
                    pC->Delay = fVar53;
                  }
                  else {
                    local_838[0]._0_8_ = local_838[0]._0_8_ & 0xffffffff00000000;
                    *(uint *)&pC->field_0x1c = uVar52 | 0x2000;
                    uVar25 = pC->iCutFunc;
                    if ((int)uVar25 < 0) {
LAB_0043107f:
                      __assert_fail("pCut->iCutFunc >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                                    ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
                    }
                    pwVar22 = p->puTempW;
                    pVVar5 = p->vTtMem[uVar52 >> 0x18];
                    if (pVVar5 == (Vec_Mem_t *)0x0) {
                      pwVar15 = (word *)0x0;
                    }
                    else {
                      uVar35 = uVar25 >> 1;
                      if (pVVar5->nEntries <= (int)uVar35) {
LAB_004310dc:
                        __assert_fail("i >= 0 && i < p->nEntries",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                      }
                      pwVar15 = pVVar5->ppPages[uVar35 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                (ulong)(uVar35 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                    }
                    uVar52 = p->nTruth6Words[uVar52 >> 0x18];
                    if ((uVar25 & 1) == 0) {
                      if (0 < (int)uVar52) {
                        uVar43 = 0;
                        do {
                          pwVar22[uVar43] = pwVar15[uVar43];
                          uVar43 = uVar43 + 1;
                        } while (uVar52 != uVar43);
                      }
                    }
                    else if (0 < (int)uVar52) {
                      uVar43 = 0;
                      do {
                        pwVar22[uVar43] = ~pwVar15[uVar43];
                        uVar43 = uVar43 + 1;
                      } while (uVar52 != uVar43);
                    }
                    bVar23 = pC->field_0x1f;
                    piVar16 = If_CutArrTimeProfile(p,pC);
                    bVar24 = pC->field_0x1f;
                    iVar11 = If_ManCutAigDelay(p,pObj,pC);
                    iVar11 = Abc_ExactDelayCost(pwVar22,(uint)bVar23,piVar16,
                                                (char *)(&pC[1].Area + bVar24),(int *)local_838,
                                                iVar11);
                    fVar53 = (float)iVar11;
                    pC->Delay = fVar53;
                    if (local_838[0].Area == 0.0047237873) {
                      uVar25 = *(uint *)&pC->field_0x1c;
                      if (0xffffff < uVar25) {
                        uVar52 = uVar25 >> 0x18;
                        lVar33 = (ulong)uVar52 - 1;
                        lVar34 = (ulong)uVar52 * 4;
                        auVar54._8_4_ = (int)lVar33;
                        auVar54._0_8_ = lVar33;
                        auVar54._12_4_ = (int)((ulong)lVar33 >> 0x20);
                        uVar43 = 0;
                        auVar55 = _DAT_0093d210;
                        auVar56 = _DAT_0093e4e0;
                        auVar57 = _DAT_009b63f0;
                        auVar58 = _DAT_009b63e0;
                        auVar59 = _DAT_009b63d0;
                        auVar60 = _DAT_009b63c0;
                        auVar61 = _DAT_009b63b0;
                        auVar62 = _DAT_009b63a0;
                        do {
                          auVar63 = auVar54 ^ _DAT_0093d220;
                          auVar66 = auVar55 ^ _DAT_0093d220;
                          iVar11 = auVar63._0_4_;
                          iVar83 = -(uint)(iVar11 < auVar66._0_4_);
                          iVar13 = auVar63._4_4_;
                          auVar67._4_4_ = -(uint)(iVar13 < auVar66._4_4_);
                          iVar51 = auVar63._8_4_;
                          iVar88 = -(uint)(iVar51 < auVar66._8_4_);
                          iVar65 = auVar63._12_4_;
                          auVar67._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
                          auVar77._4_4_ = iVar83;
                          auVar77._0_4_ = iVar83;
                          auVar77._8_4_ = iVar88;
                          auVar77._12_4_ = iVar88;
                          auVar89 = pshuflw(in_XMM14,auVar77,0xe8);
                          auVar63._4_4_ = -(uint)(auVar66._4_4_ == iVar13);
                          auVar63._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
                          auVar63._0_4_ = auVar63._4_4_;
                          auVar63._8_4_ = auVar63._12_4_;
                          auVar90 = pshuflw(in_XMM15,auVar63,0xe8);
                          auVar67._0_4_ = auVar67._4_4_;
                          auVar67._8_4_ = auVar67._12_4_;
                          auVar66 = pshuflw(auVar89,auVar67,0xe8);
                          auVar66 = (auVar66 | auVar90 & auVar89) ^ _DAT_00983080;
                          auVar66 = packssdw(auVar66,auVar66);
                          if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            *(undefined1 *)((long)&pC[1].Area + uVar43 + lVar34) = 0x78;
                          }
                          auVar67 = auVar63 & auVar77 | auVar67;
                          auVar63 = packssdw(auVar67,auVar67);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63._0_4_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Area + uVar43 + lVar34 + 1) = 0x78;
                          }
                          auVar63 = auVar56 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar63._0_4_);
                          auVar84._4_4_ = -(uint)(iVar13 < auVar63._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar63._8_4_);
                          auVar84._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
                          auVar66._4_4_ = iVar83;
                          auVar66._0_4_ = iVar83;
                          auVar66._8_4_ = iVar88;
                          auVar66._12_4_ = iVar88;
                          auVar76._4_4_ = -(uint)(auVar63._4_4_ == iVar13);
                          auVar76._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
                          auVar76._0_4_ = auVar76._4_4_;
                          auVar76._8_4_ = auVar76._12_4_;
                          auVar84._0_4_ = auVar84._4_4_;
                          auVar84._8_4_ = auVar84._12_4_;
                          auVar63 = auVar76 & auVar66 | auVar84;
                          auVar63 = packssdw(auVar63,auVar63);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Area + uVar43 + lVar34 + 2) = 0x78;
                          }
                          auVar66 = pshufhw(auVar66,auVar66,0x84);
                          auVar77 = pshufhw(auVar76,auVar76,0x84);
                          auVar67 = pshufhw(auVar66,auVar84,0x84);
                          auVar66 = (auVar67 | auVar77 & auVar66) ^ _DAT_00983080;
                          auVar66 = packssdw(auVar66,auVar66);
                          auVar66 = packsswb(auVar66,auVar66);
                          if ((auVar66._0_4_ >> 0x18 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Area + uVar43 + lVar34 + 3) = 0x78;
                          }
                          auVar66 = auVar57 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar66._0_4_);
                          auVar69._4_4_ = -(uint)(iVar13 < auVar66._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar66._8_4_);
                          auVar69._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
                          auVar78._4_4_ = iVar83;
                          auVar78._0_4_ = iVar83;
                          auVar78._8_4_ = iVar88;
                          auVar78._12_4_ = iVar88;
                          auVar63 = pshuflw(auVar63,auVar78,0xe8);
                          auVar68._4_4_ = -(uint)(auVar66._4_4_ == iVar13);
                          auVar68._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
                          auVar68._0_4_ = auVar68._4_4_;
                          auVar68._8_4_ = auVar68._12_4_;
                          auVar67 = pshuflw(auVar90 & auVar89,auVar68,0xe8);
                          auVar69._0_4_ = auVar69._4_4_;
                          auVar69._8_4_ = auVar69._12_4_;
                          auVar66 = pshuflw(auVar63,auVar69,0xe8);
                          auVar66 = (auVar66 | auVar67 & auVar63) ^ _DAT_00983080;
                          auVar66 = packssdw(auVar66,auVar66);
                          auVar66 = packsswb(auVar66,auVar66);
                          if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            *(undefined1 *)((long)&pC[1].Edge + uVar43 + lVar34) = 0x78;
                          }
                          auVar69 = auVar68 & auVar78 | auVar69;
                          auVar66 = packssdw(auVar69,auVar69);
                          auVar66 = packssdw(auVar66 ^ _DAT_00983080,auVar66 ^ _DAT_00983080);
                          auVar66 = packsswb(auVar66,auVar66);
                          if ((auVar66._4_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Edge + uVar43 + lVar34 + 1) = 0x78;
                          }
                          auVar66 = auVar58 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar66._0_4_);
                          auVar85._4_4_ = -(uint)(iVar13 < auVar66._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar66._8_4_);
                          auVar85._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
                          auVar89._4_4_ = iVar83;
                          auVar89._0_4_ = iVar83;
                          auVar89._8_4_ = iVar88;
                          auVar89._12_4_ = iVar88;
                          auVar90._4_4_ = -(uint)(auVar66._4_4_ == iVar13);
                          auVar90._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
                          auVar90._0_4_ = auVar90._4_4_;
                          auVar90._8_4_ = auVar90._12_4_;
                          auVar85._0_4_ = auVar85._4_4_;
                          auVar85._8_4_ = auVar85._12_4_;
                          auVar66 = auVar90 & auVar89 | auVar85;
                          auVar66 = packssdw(auVar66,auVar66);
                          auVar66 = packssdw(auVar66 ^ _DAT_00983080,auVar66 ^ _DAT_00983080);
                          auVar66 = packsswb(auVar66,auVar66);
                          if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            *(undefined1 *)((long)&pC[1].Edge + uVar43 + lVar34 + 2) = 0x78;
                          }
                          auVar77 = pshufhw(auVar89,auVar89,0x84);
                          auVar90 = pshufhw(auVar90,auVar90,0x84);
                          auVar89 = pshufhw(auVar77,auVar85,0x84);
                          auVar77 = (auVar89 | auVar90 & auVar77) ^ _DAT_00983080;
                          auVar77 = packssdw(auVar77,auVar77);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77._6_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Edge + uVar43 + lVar34 + 3) = 0x78;
                          }
                          auVar77 = auVar59 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar77._0_4_);
                          auVar71._4_4_ = -(uint)(iVar13 < auVar77._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar77._8_4_);
                          auVar71._12_4_ = -(uint)(iVar65 < auVar77._12_4_);
                          auVar79._4_4_ = iVar83;
                          auVar79._0_4_ = iVar83;
                          auVar79._8_4_ = iVar88;
                          auVar79._12_4_ = iVar88;
                          auVar66 = pshuflw(auVar66,auVar79,0xe8);
                          auVar70._4_4_ = -(uint)(auVar77._4_4_ == iVar13);
                          auVar70._12_4_ = -(uint)(auVar77._12_4_ == iVar65);
                          auVar70._0_4_ = auVar70._4_4_;
                          auVar70._8_4_ = auVar70._12_4_;
                          auVar67 = pshuflw(auVar67 & auVar63,auVar70,0xe8);
                          auVar71._0_4_ = auVar71._4_4_;
                          auVar71._8_4_ = auVar71._12_4_;
                          auVar63 = pshuflw(auVar66,auVar71,0xe8);
                          auVar63 = (auVar63 | auVar67 & auVar66) ^ _DAT_00983080;
                          auVar63 = packssdw(auVar63,auVar63);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            *(undefined1 *)((long)&pC[1].Power + uVar43 + lVar34) = 0x78;
                          }
                          auVar71 = auVar70 & auVar79 | auVar71;
                          auVar63 = packssdw(auVar71,auVar71);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63._8_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Power + uVar43 + lVar34 + 1) = 0x78;
                          }
                          auVar63 = auVar60 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar63._0_4_);
                          auVar86._4_4_ = -(uint)(iVar13 < auVar63._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar63._8_4_);
                          auVar86._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
                          auVar72._4_4_ = iVar83;
                          auVar72._0_4_ = iVar83;
                          auVar72._8_4_ = iVar88;
                          auVar72._12_4_ = iVar88;
                          auVar80._4_4_ = -(uint)(auVar63._4_4_ == iVar13);
                          auVar80._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
                          auVar80._0_4_ = auVar80._4_4_;
                          auVar80._8_4_ = auVar80._12_4_;
                          auVar86._0_4_ = auVar86._4_4_;
                          auVar86._8_4_ = auVar86._12_4_;
                          auVar63 = auVar80 & auVar72 | auVar86;
                          auVar63 = packssdw(auVar63,auVar63);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                            *(undefined1 *)((long)&pC[1].Power + uVar43 + lVar34 + 2) = 0x78;
                          }
                          auVar77 = pshufhw(auVar72,auVar72,0x84);
                          auVar90 = pshufhw(auVar80,auVar80,0x84);
                          auVar89 = pshufhw(auVar77,auVar86,0x84);
                          auVar77 = (auVar89 | auVar90 & auVar77) ^ _DAT_00983080;
                          auVar77 = packssdw(auVar77,auVar77);
                          auVar77 = packsswb(auVar77,auVar77);
                          if ((auVar77._10_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Power + uVar43 + lVar34 + 3) = 0x78;
                          }
                          auVar77 = auVar61 ^ _DAT_0093d220;
                          iVar83 = -(uint)(iVar11 < auVar77._0_4_);
                          auVar74._4_4_ = -(uint)(iVar13 < auVar77._4_4_);
                          iVar88 = -(uint)(iVar51 < auVar77._8_4_);
                          auVar74._12_4_ = -(uint)(iVar65 < auVar77._12_4_);
                          auVar81._4_4_ = iVar83;
                          auVar81._0_4_ = iVar83;
                          auVar81._8_4_ = iVar88;
                          auVar81._12_4_ = iVar88;
                          auVar63 = pshuflw(auVar63,auVar81,0xe8);
                          auVar73._4_4_ = -(uint)(auVar77._4_4_ == iVar13);
                          auVar73._12_4_ = -(uint)(auVar77._12_4_ == iVar65);
                          auVar73._0_4_ = auVar73._4_4_;
                          auVar73._8_4_ = auVar73._12_4_;
                          in_XMM15 = pshuflw(auVar67 & auVar66,auVar73,0xe8);
                          in_XMM15 = in_XMM15 & auVar63;
                          auVar74._0_4_ = auVar74._4_4_;
                          auVar74._8_4_ = auVar74._12_4_;
                          auVar63 = pshuflw(auVar63,auVar74,0xe8);
                          auVar63 = (auVar63 | in_XMM15) ^ _DAT_00983080;
                          auVar63 = packssdw(auVar63,auVar63);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            *(undefined1 *)((long)&pC[1].Delay + uVar43 + lVar34) = 0x78;
                          }
                          auVar74 = auVar73 & auVar81 | auVar74;
                          auVar63 = packssdw(auVar74,auVar74);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63._12_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Delay + uVar43 + lVar34 + 1) = 0x78;
                          }
                          auVar63 = auVar62 ^ _DAT_0093d220;
                          auVar87._0_4_ = -(uint)(iVar11 < auVar63._0_4_);
                          auVar87._4_4_ = -(uint)(iVar13 < auVar63._4_4_);
                          auVar87._8_4_ = -(uint)(iVar51 < auVar63._8_4_);
                          auVar87._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
                          auVar75._4_4_ = auVar87._0_4_;
                          auVar75._0_4_ = auVar87._0_4_;
                          auVar75._8_4_ = auVar87._8_4_;
                          auVar75._12_4_ = auVar87._8_4_;
                          iVar11 = -(uint)(auVar63._4_4_ == iVar13);
                          iVar13 = -(uint)(auVar63._12_4_ == iVar65);
                          auVar64._4_4_ = iVar11;
                          auVar64._0_4_ = iVar11;
                          auVar64._8_4_ = iVar13;
                          auVar64._12_4_ = iVar13;
                          auVar82._4_4_ = auVar87._4_4_;
                          auVar82._0_4_ = auVar87._4_4_;
                          auVar82._8_4_ = auVar87._12_4_;
                          auVar82._12_4_ = auVar87._12_4_;
                          in_XMM14 = auVar64 & auVar75 | auVar82;
                          auVar63 = packssdw(auVar87,in_XMM14);
                          auVar63 = packssdw(auVar63 ^ _DAT_00983080,auVar63 ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            *(undefined1 *)((long)&pC[1].Delay + uVar43 + lVar34 + 2) = 0x78;
                          }
                          auVar66 = pshufhw(auVar75,auVar75,0x84);
                          auVar63 = pshufhw(auVar64,auVar64,0x84);
                          auVar67 = pshufhw(auVar66,auVar82,0x84);
                          auVar63 = packssdw(auVar63 & auVar66,
                                             (auVar67 | auVar63 & auVar66) ^ _DAT_00983080);
                          auVar63 = packsswb(auVar63,auVar63);
                          if ((auVar63._14_2_ >> 8 & 1) != 0) {
                            *(undefined1 *)((long)&pC[1].Delay + uVar43 + lVar34 + 3) = 0x78;
                          }
                          uVar43 = uVar43 + 0x10;
                          lVar33 = auVar55._8_8_;
                          auVar55._0_8_ = auVar55._0_8_ + 0x10;
                          auVar55._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar56._8_8_;
                          auVar56._0_8_ = auVar56._0_8_ + 0x10;
                          auVar56._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar57._8_8_;
                          auVar57._0_8_ = auVar57._0_8_ + 0x10;
                          auVar57._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar58._8_8_;
                          auVar58._0_8_ = auVar58._0_8_ + 0x10;
                          auVar58._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar59._8_8_;
                          auVar59._0_8_ = auVar59._0_8_ + 0x10;
                          auVar59._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar60._8_8_;
                          auVar60._0_8_ = auVar60._0_8_ + 0x10;
                          auVar60._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar61._8_8_;
                          auVar61._0_8_ = auVar61._0_8_ + 0x10;
                          auVar61._8_8_ = lVar33 + 0x10;
                          lVar33 = auVar62._8_8_;
                          auVar62._0_8_ = auVar62._0_8_ + 0x10;
                          auVar62._8_8_ = lVar33 + 0x10;
                        } while ((uVar52 + 0xf & 0xfffffff0) != uVar43);
                      }
                      *(uint *)&pC->field_0x1c = uVar25 | 0x4fff;
                    }
                  }
                }
                else {
                  iVar11 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_0042fb0c:
                  fVar53 = (float)iVar11;
                  pC->Delay = fVar53;
                }
                if (((fVar53 != -1.0) || (NAN(fVar53))) &&
                   ((bVar10 || (fVar53 <= pObj->Required + p->fEpsilon)))) {
                  if (Mode == 2) {
                    fVar53 = If_CutAreaDerefed(p,pC);
                    pC->Area = fVar53;
                    pIVar17 = p->pPars;
                    if (pIVar17->fEdge != 0) {
                      fVar53 = If_CutEdgeDerefed(p,pC);
                      pC->Edge = fVar53;
                      pIVar17 = p->pPars;
                    }
                    if (pIVar17->fPower != 0) {
                      fVar53 = If_CutPowerDerefed(p,pC,pObj);
LAB_0042fbdc:
                      pC->Power = fVar53;
                    }
                  }
                  else {
                    fVar53 = If_CutAreaFlow(p,pC);
                    pC->Area = fVar53;
                    pIVar17 = p->pPars;
                    if (pIVar17->fEdge != 0) {
                      fVar53 = If_CutEdgeFlow(p,pC);
                      pC->Edge = fVar53;
                      pIVar17 = p->pPars;
                    }
                    if (pIVar17->fPower != 0) {
                      fVar53 = If_CutPowerFlow(p,pC,pObj);
                      goto LAB_0042fbdc;
                    }
                  }
                  If_CutSort(p,(If_Set_t *)pIVar14,pC);
                }
              }
            }
          }
LAB_0042efa6:
          lVar31 = lVar31 + 1;
          pIVar21 = pObj->pFanin1->pCutSet;
        } while (lVar31 < pIVar21->nCuts);
        pIVar20 = pObj->pFanin0;
      }
      lVar45 = lVar45 + 1;
      pIVar21 = pIVar20->pCutSet;
    } while (lVar45 < pIVar21->nCuts);
  }
  if (*(short *)((long)&pIVar14->pName + 2) < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0x1cc,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((fPreprocess == 0) ||
     ((*(If_Cut_t **)pIVar14->pConst1)->Delay <= pObj->Required + p->fEpsilon)) {
    memcpy(pCut,*(If_Cut_t **)pIVar14->pConst1,(long)p->nCutBytes);
    if (((p->pPars->fUserRecLib != 0) || (p->pPars->fUserSesLib != 0)) &&
       (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
        (pfVar29 = &(pObj->CutBest).Delay, 1e+09 < *pfVar29 || *pfVar29 == 1e+09)))) {
      __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x1d4,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  pIVar47 = pIVar14;
  if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
    pIVar20 = pIVar14->pConst1;
    sVar4 = *(short *)((long)&pIVar14->pName + 2);
    *(short *)((long)&pIVar14->pName + 2) = sVar4 + 1;
    pIVar47 = p;
    If_ManSetupCutTriv(p,*(If_Cut_t **)((long)&pIVar20->field_0x0 + (long)sVar4 * 8),pObj->Id);
    if (*(short *)&pIVar14->pName + 1 < (int)*(short *)((long)&pIVar14->pName + 2)) {
      __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x1da,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  iVar11 = (int)pIVar47;
  if ((!bVar10) && (0 < pObj->nRefs)) {
    pIVar14 = p;
    If_CutAreaRef(p,pCut);
    iVar11 = (int)pIVar14;
  }
  if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
    Abc_Print(iVar11,"The best cut is useless.\n");
  }
  if ((p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) &&
     (pIVar21 = pObj->pCutSet, 0 < pIVar21->nCuts)) {
    lVar45 = 0;
    do {
      if (pIVar21->ppCuts[lVar45] == (If_Cut_t *)0x0) break;
      (*p->pPars->pFuncUser)(p,pObj,pIVar21->ppCuts[lVar45]);
      lVar45 = lVar45 + 1;
      pIVar21 = pObj->pCutSet;
    } while (lVar45 < pIVar21->nCuts);
  }
  If_ManDerefNodeCutSet(p,pObj);
  return;
LAB_00430a0f:
  iVar65 = 1;
LAB_00430a14:
  iVar13 = iVar65 + iVar13;
  if (uVar19 < 6) {
    uVar44 = 0;
    do {
      if (((local_438[uVar44] >> ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) ^ local_438[uVar44]) &
          s_Truths6Neg[uVar19]) != 0) goto LAB_00430aa6;
      uVar44 = uVar44 + 1;
    } while (uVar26 != uVar44);
    uVar27 = 0;
  }
  else {
    uVar44 = (ulong)(uint)(1 << (bVar23 - 6 & 0x1f));
    uVar48 = 2 << (bVar23 - 6 & 0x1f);
    puVar50 = local_438 + uVar44;
    puVar38 = local_438;
    do {
      uVar30 = 0;
      do {
        if (puVar38[uVar30] != puVar50[uVar30]) goto LAB_00430aa6;
        uVar30 = uVar30 + 1;
      } while (uVar44 != uVar30);
      puVar38 = puVar38 + uVar48;
      puVar50 = puVar50 + uVar48;
      uVar27 = 0;
    } while (puVar38 < local_438 + (int)uVar12);
  }
LAB_00430ab0:
  if ((iVar11 < iVar13) || (iVar51 = iVar51 + uVar27, iVar11 < iVar51)) goto LAB_00430b2a;
LAB_00430ac0:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar43) goto LAB_00430cc3;
  goto LAB_00430916;
LAB_00430aa6:
  uVar27 = 1;
  goto LAB_00430ab0;
LAB_00430b2a:
  if (((int)uVar43 == (int)uVar19) || (uVar19 = uVar28 + 1, uVar28 = uVar43, uVar19 == uVar43))
  goto LAB_00430cc3;
  goto LAB_00430893;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
        p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct || p->pPars->pFuncCell2;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fLut6Filter && pCut->nLeaves == 6 && !If_CutCheckTruth6(p, pCut) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell || p->pPars->pFuncCell2 )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else if ( p->pPars->pFuncCell2 )
                    pCut->fUseless = !p->pPars->pFuncCell2( p, (word *)If_CutTruthW(p, pCut), pCut->nLeaves, NULL, NULL );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if ( p->pPars->fUserRecLib || p->pPars->fUserSesLib )
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}